

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O0

void __thiscall Assimp::MD5::MD5Parser::MD5Parser(MD5Parser *this,char *_buffer,uint _fileSize)

{
  bool bVar1;
  Logger *pLVar2;
  reference out;
  size_type sVar3;
  char local_128 [8];
  char szBuffer [128];
  Section *sec;
  pointer pEStack_90;
  pointer local_88;
  pointer pEStack_80;
  string local_78;
  string local_58;
  byte local_2d;
  bool running;
  uint local_1c;
  char *pcStack_18;
  uint _fileSize_local;
  char *_buffer_local;
  MD5Parser *this_local;
  
  local_1c = _fileSize;
  pcStack_18 = _buffer;
  _buffer_local = (char *)this;
  std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::vector(&this->mSections)
  ;
  if (pcStack_18 == (char *)0x0 || local_1c == 0) {
    __assert_fail("__null != _buffer && 0 != _fileSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MD5/MD5Parser.cpp"
                  ,0x42,"Assimp::MD5::MD5Parser::MD5Parser(char *, unsigned int)");
  }
  this->buffer = pcStack_18;
  this->fileSize = local_1c;
  this->lineNumber = 0;
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"MD5Parser begin");
  ParseHeader(this);
  local_2d = 1;
  do {
    if ((local_2d & 1) == 0) break;
    local_58.field_2._M_allocated_capacity = 0;
    local_58.field_2._8_8_ = 0;
    local_58._M_dataplus = (_Alloc_hider)0x0;
    local_58._1_7_ = 0;
    local_58._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    local_78.field_2._8_8_ = 0;
    local_78._M_dataplus = (_Alloc_hider)0x0;
    local_78._1_7_ = 0;
    local_78._M_string_length = 0;
    local_88 = (pointer)0x0;
    pEStack_80 = (pointer)0x0;
    sec = (Section *)0x0;
    pEStack_90 = (pointer)0x0;
    Section::Section((Section *)&sec);
    std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::push_back
              (&this->mSections,(Section *)&sec);
    Section::~Section((Section *)&sec);
    out = std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::back
                    (&this->mSections);
    bVar1 = ParseSection(this,out);
  } while (bVar1);
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    sVar3 = std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::size
                      (&this->mSections);
    snprintf(local_128,0x80,"MD5Parser end. Parsed %i sections",sVar3 & 0xffffffff);
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,local_128);
  }
  return;
}

Assistant:

MD5Parser::MD5Parser(char* _buffer, unsigned int _fileSize )
{
    ai_assert(NULL != _buffer && 0 != _fileSize);

    buffer = _buffer;
    fileSize = _fileSize;
    lineNumber = 0;

    ASSIMP_LOG_DEBUG("MD5Parser begin");

    // parse the file header
    ParseHeader();

    // and read all sections until we're finished
    bool running = true;
    while (running) {
        mSections.push_back(Section());
        Section& sec = mSections.back();
        if(!ParseSection(sec))  {
            break;
        }
    }

    if ( !DefaultLogger::isNullLogger())    {
        char szBuffer[128]; // should be sufficiently large
        ::ai_snprintf(szBuffer,128,"MD5Parser end. Parsed %i sections",(int)mSections.size());
        ASSIMP_LOG_DEBUG(szBuffer);
    }
}